

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void google::protobuf::internal::SwapFieldHelper::SwapRepeatedStringField<true>
               (Reflection *r,Message *lhs,Message *rhs,FieldDescriptor *field)

{
  CppStringType CVar1;
  RepeatedField<absl::lts_20250127::Cord> *this;
  RepeatedField<absl::lts_20250127::Cord> *other;
  RepeatedPtrFieldBase *this_00;
  RepeatedPtrFieldBase *rhs_00;
  RepeatedPtrFieldBase *rhs_string;
  RepeatedPtrFieldBase *lhs_string;
  RepeatedField<absl::lts_20250127::Cord> *rhs_cord;
  RepeatedField<absl::lts_20250127::Cord> *lhs_cord;
  FieldDescriptor *field_local;
  Message *rhs_local;
  Message *lhs_local;
  Reflection *r_local;
  
  CVar1 = FieldDescriptor::cpp_string_type(field);
  if (CVar1 != kView) {
    if (CVar1 == kCord) {
      this = Reflection::MutableRaw<google::protobuf::RepeatedField<absl::lts_20250127::Cord>>
                       (r,lhs,field);
      other = Reflection::MutableRaw<google::protobuf::RepeatedField<absl::lts_20250127::Cord>>
                        (r,rhs,field);
      RepeatedField<absl::lts_20250127::Cord>::InternalSwap(this,other);
      return;
    }
    if (CVar1 != kString) {
      return;
    }
  }
  this_00 = Reflection::MutableRaw<google::protobuf::internal::RepeatedPtrFieldBase>(r,lhs,field);
  rhs_00 = Reflection::MutableRaw<google::protobuf::internal::RepeatedPtrFieldBase>(r,rhs,field);
  RepeatedPtrFieldBase::InternalSwap(this_00,rhs_00);
  return;
}

Assistant:

void SwapFieldHelper::SwapRepeatedStringField(const Reflection* r, Message* lhs,
                                              Message* rhs,
                                              const FieldDescriptor* field) {
  switch (field->cpp_string_type()) {
    case FieldDescriptor::CppStringType::kCord: {
      auto* lhs_cord = r->MutableRaw<RepeatedField<absl::Cord>>(lhs, field);
      auto* rhs_cord = r->MutableRaw<RepeatedField<absl::Cord>>(rhs, field);
      if (unsafe_shallow_swap) {
        lhs_cord->InternalSwap(rhs_cord);
      } else {
        lhs_cord->Swap(rhs_cord);
      }
      break;
    }
    case FieldDescriptor::CppStringType::kView:
    case FieldDescriptor::CppStringType::kString: {
      auto* lhs_string = r->MutableRaw<RepeatedPtrFieldBase>(lhs, field);
      auto* rhs_string = r->MutableRaw<RepeatedPtrFieldBase>(rhs, field);
      if (unsafe_shallow_swap) {
        lhs_string->InternalSwap(rhs_string);
      } else {
        lhs_string->Swap<GenericTypeHandler<std::string>>(rhs_string);
      }
      break;
    }
  }
}